

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O0

Offset<reflection::Service>
reflection::CreateService
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> calls
          ,Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
           attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,Offset<flatbuffers::String> declaration_file)

{
  Offset<reflection::Service> OVar1;
  undefined1 local_38 [8];
  ServiceBuilder builder_;
  FlatBufferBuilder *_fbb_local;
  Offset<flatbuffers::String> declaration_file_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
  documentation_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
  attributes_local;
  Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::RPCCall>,_unsigned_int>_> calls_local;
  Offset<flatbuffers::String> name_local;
  
  builder_._8_8_ = _fbb;
  ServiceBuilder::ServiceBuilder((ServiceBuilder *)local_38,_fbb);
  ServiceBuilder::add_declaration_file((ServiceBuilder *)local_38,declaration_file);
  ServiceBuilder::add_documentation((ServiceBuilder *)local_38,documentation);
  ServiceBuilder::add_attributes((ServiceBuilder *)local_38,attributes);
  ServiceBuilder::add_calls((ServiceBuilder *)local_38,calls);
  ServiceBuilder::add_name((ServiceBuilder *)local_38,name);
  OVar1 = ServiceBuilder::Finish((ServiceBuilder *)local_38);
  return (Offset<reflection::Service>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Service> CreateService(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::RPCCall>>> calls = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    ::flatbuffers::Offset<::flatbuffers::String> declaration_file = 0) {
  ServiceBuilder builder_(_fbb);
  builder_.add_declaration_file(declaration_file);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_calls(calls);
  builder_.add_name(name);
  return builder_.Finish();
}